

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btBoxBoxCollisionAlgorithm::processCollision
          (btBoxBoxCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  btBoxBoxDetector *in_RDI;
  btManifoldResult *in_R8;
  btBoxBoxDetector detector;
  btIDebugDraw *in_stack_00000048;
  ClosestPointInput input;
  btBoxShape *box1;
  btBoxShape *box0;
  btTransform *in_stack_fffffffffffffef8;
  ClosestPointInput *in_stack_ffffffffffffff00;
  btBoxShape *box1_00;
  btManifoldResult *in_stack_ffffffffffffff30;
  btBoxShape local_bc;
  undefined4 local_3c;
  btCollisionShape *local_38;
  btCollisionShape *local_30;
  btManifoldResult *local_28;
  btCollisionObjectWrapper *local_18;
  btCollisionObjectWrapper *local_10;
  
  if (in_RDI[1].super_btDiscreteCollisionDetectorInterface.
      _vptr_btDiscreteCollisionDetectorInterface != (_func_int **)0x0) {
    local_28 = in_R8;
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_30 = btCollisionObjectWrapper::getCollisionShape(in_RSI);
    local_38 = btCollisionObjectWrapper::getCollisionShape(local_18);
    btManifoldResult::setPersistentManifold
              (local_28,(btPersistentManifold *)
                        in_RDI[1].super_btDiscreteCollisionDetectorInterface.
                        _vptr_btDiscreteCollisionDetectorInterface);
    box1_00 = &local_bc;
    btDiscreteCollisionDetectorInterface::ClosestPointInput::ClosestPointInput
              (in_stack_ffffffffffffff00);
    local_3c = 0x5d5e0b6b;
    btCollisionObjectWrapper::getWorldTransform(local_10);
    btTransform::operator=(&in_stack_ffffffffffffff00->m_transformA,in_stack_fffffffffffffef8);
    btCollisionObjectWrapper::getWorldTransform(local_18);
    btTransform::operator=(&in_stack_ffffffffffffff00->m_transformA,in_stack_fffffffffffffef8);
    btBoxBoxDetector::btBoxBoxDetector(in_RDI,box1_00,(btBoxShape *)&stack0xffffffffffffff28);
    btBoxBoxDetector::getClosestPoints
              ((btBoxBoxDetector *)input.m_transformA.m_basis.m_el[1].m_floats._4_8_,
               (ClosestPointInput *)input.m_transformA.m_basis.m_el._12_8_,
               (Result *)input.m_transformA.m_basis.m_el[0].m_floats._4_8_,in_stack_00000048,
               detector.m_box2._7_1_);
    if (((ulong)in_RDI->m_box2 & 1) != 0) {
      btManifoldResult::refreshContactPoints(in_stack_ffffffffffffff30);
    }
    btBoxBoxDetector::~btBoxBoxDetector((btBoxBoxDetector *)0x170c53);
  }
  return;
}

Assistant:

void btBoxBoxCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	if (!m_manifoldPtr)
		return;

	
	const btBoxShape* box0 = (btBoxShape*)body0Wrap->getCollisionShape();
	const btBoxShape* box1 = (btBoxShape*)body1Wrap->getCollisionShape();



	/// report a contact. internally this will be kept persistent, and contact reduction is done
	resultOut->setPersistentManifold(m_manifoldPtr);
#ifndef USE_PERSISTENT_CONTACTS	
	m_manifoldPtr->clearManifold();
#endif //USE_PERSISTENT_CONTACTS

	btDiscreteCollisionDetectorInterface::ClosestPointInput input;
	input.m_maximumDistanceSquared = BT_LARGE_FLOAT;
	input.m_transformA = body0Wrap->getWorldTransform();
	input.m_transformB = body1Wrap->getWorldTransform();

	btBoxBoxDetector detector(box0,box1);
	detector.getClosestPoints(input,*resultOut,dispatchInfo.m_debugDraw);

#ifdef USE_PERSISTENT_CONTACTS
	//  refreshContactPoints is only necessary when using persistent contact points. otherwise all points are newly added
	if (m_ownManifold)
	{
		resultOut->refreshContactPoints();
	}
#endif //USE_PERSISTENT_CONTACTS

}